

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

Arch doctest::anon_unknown_14::Endianness::which(void)

{
  char *ptr;
  int x;
  
  return Little;
}

Assistant:

static Arch which() {
            int x = 1;
            // casting any data pointer to char* is allowed
            auto ptr = reinterpret_cast<char*>(&x);
            if(*ptr)
                return Little;
            return Big;
        }